

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O2

int anon_unknown.dwarf_1ef7149::ConvolveScaleTestBase<unsigned_char>::RandomSubpel(ACMRandom *rnd)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  
  bVar1 = libaom_test::ACMRandom::Rand8(rnd);
  bVar1 = bVar1 & 7;
  uVar3 = (uint)bVar1;
  if (bVar1 != 0) {
    if (bVar1 == 1) {
      uVar3 = 0x3ff;
    }
    else {
      uVar2 = testing::internal::Random::Generate(&rnd->random_,0x3fe);
      uVar3 = uVar2 + 1;
    }
  }
  return uVar3;
}

Assistant:

static int RandomSubpel(ACMRandom *rnd) {
    const uint8_t subpel_mode = rnd->Rand8();
    if ((subpel_mode & 7) == 0) {
      return 0;
    } else if ((subpel_mode & 7) == 1) {
      return SCALE_SUBPEL_SHIFTS - 1;
    } else {
      return 1 + rnd->PseudoUniform(SCALE_SUBPEL_SHIFTS - 2);
    }
  }